

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiApi::MidiApi(MidiApi *this)

{
  MidiApi *this_local;
  
  this->_vptr_MidiApi = (_func_int **)&PTR__MidiApi_00126a78;
  this->apiData_ = (void *)0x0;
  this->connected_ = false;
  std::__cxx11::string::string((string *)&this->errorString_);
  this->errorCallback_ = (RtMidiErrorCallback)0x0;
  this->firstErrorOccurred_ = false;
  this->errorCallbackUserData_ = (void *)0x0;
  return;
}

Assistant:

MidiApi :: MidiApi( void )
  : apiData_( 0 ), connected_( false ), errorCallback_(0), firstErrorOccurred_(false), errorCallbackUserData_(0)
{
}